

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

shared_ptr<dap::Reader> __thiscall
dap::spy(dap *this,shared_ptr<dap::Reader> *r,shared_ptr<dap::Writer> *s,char *prefix)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<dap::Reader> sVar5;
  allocator<char> local_51;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  puVar3 = (undefined8 *)operator_new(0x58);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_00b2d2b0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,prefix,&local_51);
  peVar1 = (r->super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (r->super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  puVar3[2] = &PTR__ReaderSpy_00b2d320;
  puVar3[3] = peVar1;
  puVar3[4] = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  puVar3[5] = (s->super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (s->super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  puVar3[6] = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  puVar3[7] = puVar3 + 9;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar3 + 7),local_50,local_48 + (long)local_50);
  _Var4._M_pi = extraout_RDX;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
    _Var4._M_pi = extraout_RDX_00;
  }
  *(undefined8 **)this = puVar3 + 2;
  *(undefined8 **)(this + 8) = puVar3;
  sVar5.super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<dap::Reader>)sVar5.super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reader> spy(const std::shared_ptr<Reader>& r,
                            const std::shared_ptr<Writer>& s,
                            const char* prefix /* = "\n<-" */) {
  return std::make_shared<ReaderSpy>(r, s, prefix);
}